

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O3

int __thiscall dtlsopenssl::DtlsState::init(DtlsState *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  BIO *b;
  QHostAddress *in_RCX;
  QUdpSocket *in_RDX;
  quint16 in_R8W;
  QByteArray *in_R9;
  
  if (((this->tlsContext).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) && (bVar1 = initTls(this,(QDtlsBasePrivate *)ctx), !bVar1)) {
    return 0;
  }
  this->udpSocket = in_RDX;
  setLinkMtu(this,(QDtlsBasePrivate *)ctx);
  QByteArray::operator=(&this->dgram,in_R9);
  QHostAddress::operator=(&this->remoteAddress,in_RCX);
  this->remotePort = in_R8W;
  b = q_SSL_get_rbio((this->tlsConnection).value.ptr);
  iVar2 = q_BIO_set_ex_data(b,0,this);
  return (int)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
}

Assistant:

bool DtlsState::init(QDtlsBasePrivate *dtlsBase, QUdpSocket *socket,
                     const QHostAddress &remote, quint16 port,
                     const QByteArray &receivedMessage)
{
    Q_ASSERT(dtlsBase);
    Q_ASSERT(socket);

    if (!tlsContext && !initTls(dtlsBase))
        return false;

    udpSocket = socket;

    setLinkMtu(dtlsBase);

    dgram = receivedMessage;
    remoteAddress = remote;
    remotePort = port;

    // SSL_get_rbio does not increment a reference count.
    BIO *bio = q_SSL_get_rbio(tlsConnection.data());
    Q_ASSERT(bio);
    q_BIO_set_app_data(bio, this);

    return true;
}